

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_e1608::ImageManager::~ImageManager(ImageManager *this)

{
  pointer pIVar1;
  Image *pIVar2;
  ReferenceOwner *pRVar3;
  pointer ppRVar4;
  CopyForm1 p_Var5;
  long lVar6;
  ulong uVar7;
  pointer ppCVar8;
  
  ppCVar8 = (this->_input).
            super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar8 !=
      (this->_input).
      super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppCVar8 != (ConstReferenceOwner *)0x0) {
        operator_delete(*ppCVar8);
      }
      ppCVar8 = ppCVar8 + 1;
    } while (ppCVar8 !=
             (this->_input).
             super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppRVar4 = (this->_output).
            super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_output).
      super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppRVar4) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pIVar1 = (this->_outputClone).
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = ppRVar4[uVar7]->data;
      p_Var5 = ImageTypeManager::convert(this->_registrator,(&pIVar1->_type)[lVar6],pIVar2->_type);
      (*p_Var5)((Image *)((long)&pIVar1->_vptr_ImageTemplate + lVar6),pIVar2);
      pRVar3 = (this->_output).
               super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7];
      if (pRVar3 != (ReferenceOwner *)0x0) {
        operator_delete(pRVar3);
      }
      uVar7 = uVar7 + 1;
      ppRVar4 = (this->_output).
                super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x28;
    } while (uVar7 < (ulong)((long)(this->_output).
                                   super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar4 >> 3))
    ;
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&this->_outputClone);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&this->_inputClone);
  ppRVar4 = (this->_output).
            super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != (pointer)0x0) {
    operator_delete(ppRVar4);
  }
  ppCVar8 = (this->_input).
            super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar8 != (pointer)0x0) {
    operator_delete(ppCVar8);
    return;
  }
  return;
}

Assistant:

~ImageManager()
        {
            for ( std::vector<ConstReferenceOwner *>::iterator data = _input.begin(); data != _input.end(); ++data )
                delete *data;

            for ( size_t i = 0u; i < _output.size(); ++i ) {
                _restore( _outputClone[i], _output[i]->data );

                delete _output[i];
            }
        }